

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

int mk_sched_launch_thread(mk_server *server,pthread_t *tout)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  undefined8 *__arg;
  int line;
  pthread_t tid;
  pthread_attr_t attr;
  
  server->pth_init = 0;
  __mutex = &server->pth_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  __arg = (undefined8 *)mk_mem_alloc_z(8);
  *__arg = server;
  pthread_attr_init((pthread_attr_t *)&attr);
  pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
  iVar1 = pthread_create(&tid,(pthread_attr_t *)&attr,mk_sched_launch_worker_loop,__arg);
  if (iVar1 == 0) {
    *tout = tid;
    while (server->pth_init == 0) {
      pthread_cond_wait((pthread_cond_t *)&server->pth_cond,(pthread_mutex_t *)__mutex);
    }
    iVar1 = 0;
  }
  else {
    mk_utils_libc_error("pthread_create",(char *)0x1bd,line);
    iVar1 = -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return iVar1;
}

Assistant:

int mk_sched_launch_thread(struct mk_server *server, pthread_t *tout)
{
    pthread_t tid;
    pthread_attr_t attr;
    struct mk_sched_thread_conf *thconf;

    server->pth_init = MK_FALSE;

    /*
     * This lock is used for the 'pth_cond' conditional. Once the worker
     * thread is ready it will signal the condition.
     */
    pthread_mutex_lock(&server->pth_mutex);

    /* Thread data */
    thconf = mk_mem_alloc_z(sizeof(struct mk_sched_thread_conf));
    thconf->server = server;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(&tid, &attr, mk_sched_launch_worker_loop,
                       (void *) thconf) != 0) {
        mk_libc_error("pthread_create");
        pthread_mutex_unlock(&server->pth_mutex);
        return -1;
    }

    *tout = tid;

    /* Block until the child thread is ready */
    while (!server->pth_init) {
        pthread_cond_wait(&server->pth_cond, &server->pth_mutex);
    }

    pthread_mutex_unlock(&server->pth_mutex);

    return 0;
}